

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O2

string * __thiscall
sqlcheck::PatternTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,sqlcheck *this,PatternType *pattern_type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(*(undefined4 *)this) {
  case 1:
    pcVar2 = "PHYSICAL_DATABASE_DESIGN ANTI-PATTERN";
    paVar1 = &local_9;
    break;
  case 2:
    pcVar2 = "LOGICAL_DATABASE_DESIGN ANTI-PATTERN";
    paVar1 = &local_a;
    break;
  case 3:
    pcVar2 = "QUERY ANTI-PATTERN";
    paVar1 = &local_b;
    break;
  case 4:
    pcVar2 = "APPLICATION ANTI-PATTERN";
    paVar1 = &local_c;
    break;
  default:
    pcVar2 = "INVALID";
    paVar1 = &local_d;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string PatternTypeToString(const PatternType& pattern_type){

  switch (pattern_type) {
    case PATTERN_TYPE_PHYSICAL_DATABASE_DESIGN:
      return "PHYSICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_LOGICAL_DATABASE_DESIGN:
      return "LOGICAL_DATABASE_DESIGN ANTI-PATTERN";
    case PATTERN_TYPE_QUERY:
      return "QUERY ANTI-PATTERN";
    case PATTERN_TYPE_APPLICATION:
      return "APPLICATION ANTI-PATTERN";

    case PATTERN_TYPE_INVALID:
    default:
      return "INVALID";
  }

}